

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

int __thiscall
sznet::net::Connector::connect(Connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  sz_sock sockfd;
  int iVar2;
  uint v;
  int extraout_EAX;
  int extraout_EAX_00;
  sockaddr *addr;
  SourceFile file;
  SourceFile file_00;
  Logger local_ff0;
  
  sockfd = sockets::sz_sock_createnonblockingordie
                     ((uint)(this->m_serverAddr).field_0.m_addr.sin_family);
  addr = sockets::sz_sockaddr_cast((sockaddr_in6 *)&this->m_serverAddr);
  iVar2 = sockets::sz_sock_connect(sockfd,addr);
  if (iVar2 == 0) goto LAB_00135ca5;
  v = sz_getlasterr();
  uVar1 = v - 0x58;
  if (uVar1 < 0x1c) {
    if ((0x802c00U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_00135cc2;
    if ((0x4000201U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x8040000U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_00135ca5;
      goto LAB_00135c01;
    }
LAB_00135c1a:
    file._8_8_ = 0xd;
    file.m_data = "Connector.cpp";
    Logger::Logger(&local_ff0,file,0x6e,false);
    if (0x28 < (uint)(((int)&local_ff0 + 0xfb0) - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,
                      "connect error in Connector::startInLoop ",0x28);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 0x28;
    }
    LogStream::operator<<(&local_ff0.m_impl.m_stream,v);
  }
  else {
LAB_00135c01:
    if (v < 0xf) {
      if ((0x6202U >> (v & 0x1f) & 1) != 0) goto LAB_00135c1a;
      if ((0x11U >> (v & 0x1f) & 1) != 0) {
LAB_00135ca5:
        connecting(this,sockfd);
        return extraout_EAX;
      }
      if (v == 0xb) {
LAB_00135cc2:
        retry(this,sockfd);
        return extraout_EAX_00;
      }
    }
    file_00._8_8_ = 0xd;
    file_00.m_data = "Connector.cpp";
    Logger::Logger(&local_ff0,file_00,0x72,false);
    if (0x2b < (uint)(((int)&local_ff0 + 0xfb0) - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,
                      "Unexpected error in Connector::startInLoop ",0x2b);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 0x2b;
    }
    LogStream::operator<<(&local_ff0.m_impl.m_stream,v);
  }
  Logger::~Logger(&local_ff0);
  iVar2 = sockets::sz_closesocket(sockfd);
  return iVar2;
}

Assistant:

void Connector::connect()
{
	sockets::sz_sock sockfd = sockets::sz_sock_createnonblockingordie(m_serverAddr.family());
	int ret = sockets::sz_sock_connect(sockfd, m_serverAddr.getSockAddr());
	int savedErrno = (ret == 0) ? 0 : sz_getlasterr();
	switch (savedErrno)
	{
	// ���ӳɹ�
	case 0:
	case sz_err_inprogress:
	// ���ﲻ�԰ɣ�
	case sz_err_eintr:
	case sz_err_eisconn:
#ifdef SZ_OS_WINDOWS
	case sz_err_wouldblock:
#endif
		connecting(sockfd);
		break;
#ifdef SZ_OS_LINUX
	case sz_err_again:
#endif
	case sz_err_eaddrinuse:
	case sz_err_eaddrnotavail:
	case sz_err_econnrefused:
	case sz_err_enetunreach:
		retry(sockfd);
		break;
	case sz_err_eacces:
#ifdef SZ_OS_LINUX
	case sz_err_eperm:
#endif
	case sz_err_eafnosupport:
	case sz_err_ealready:
	case sz_err_ebadf:
	case sz_err_efault:
	case sz_err_enotsock:
		LOG_SYSERR << "connect error in Connector::startInLoop " << savedErrno;
		sockets::sz_closesocket(sockfd);
		break;
	default:
		LOG_SYSERR << "Unexpected error in Connector::startInLoop " << savedErrno;
		sockets::sz_closesocket(sockfd);
		break;
	}
}